

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-pool.inc.c
# Opt level: O0

void new_pool_insert(TCGContext_conflict9 *s,TCGLabelPoolData *n)

{
  uint uVar1;
  TCGLabelPoolData *pTVar2;
  int iVar3;
  TCGLabelPoolData *pTStack_28;
  int nlong;
  TCGLabelPoolData **pp;
  TCGLabelPoolData *i;
  TCGLabelPoolData *n_local;
  TCGContext_conflict9 *s_local;
  
  uVar1 = n->nlong;
  pTVar2 = (TCGLabelPoolData *)&s->pool_labels;
  do {
    pTStack_28 = pTVar2;
    pTVar2 = pTStack_28->next;
    if ((pTVar2 == (TCGLabelPoolData *)0x0) || (pTVar2->nlong < uVar1)) break;
  } while ((uVar1 < pTVar2->nlong) ||
          (iVar3 = memcmp(n + 1,pTVar2 + 1,(long)(int)uVar1 << 3), iVar3 < 0));
  n->next = pTStack_28->next;
  pTStack_28->next = n;
  return;
}

Assistant:

static void new_pool_insert(TCGContext *s, TCGLabelPoolData *n)
{
    TCGLabelPoolData *i, **pp;
    int nlong = n->nlong;

    /* Insertion sort on the pool.  */
    for (pp = &s->pool_labels; (i = *pp) != NULL; pp = &i->next) {
        if (nlong > i->nlong) {
            break;
        }
        if (nlong < i->nlong) {
            continue;
        }
        if (memcmp(n->data, i->data, sizeof(tcg_target_ulong) * nlong) >= 0) {
            break;
        }
    }
    n->next = *pp;
    *pp = n;
}